

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void rotateParams(void)

{
  bool bVar1;
  unkuint9 Var2;
  unkuint9 Var3;
  int param;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  float fVar10;
  float newParams [9];
  float local_48 [10];
  
  local_48[4] = 0.0;
  local_48[5] = 0.0;
  local_48[6] = 0.0;
  local_48[7] = 0.0;
  local_48[0] = 0.0;
  local_48[1] = 0.0;
  local_48[2] = 0.0;
  local_48[3] = 0.0;
  local_48[8] = 0.0;
  Var2 = (unkuint9)phi_n;
  Var3 = (unkuint9)theta_n;
  lVar4 = 0;
  iVar8 = 0;
  do {
    iVar7 = 0;
    uVar6 = 0;
    do {
      fVar9 = sinf(((float)(int)uVar6 * 3.1415927) / (float)phi_n);
      if (theta_n != 0) {
        fVar10 = local_48[lVar4];
        sVar5 = 0;
        do {
          fVar10 = fVar10 + legendre_scalars.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start[(long)(iVar7 + iVar8) + sVar5]
                            * shape_scalars.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start[(long)iVar7 + sVar5 + 1] *
                            (3.1415927 / (float)(unkint9)Var2) * (6.2831855 / (float)(unkint9)Var3)
                            * fVar9;
          sVar5 = sVar5 + 1;
        } while (theta_n != sVar5);
        local_48[lVar4] = fVar10;
      }
      iVar7 = iVar7 + (int)theta_n + 1;
      bVar1 = uVar6 < phi_n;
      uVar6 = uVar6 + 1;
    } while (bVar1);
    iVar8 = iVar7 + iVar8;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 9);
  lVar4 = 0;
  do {
    *(float *)((long)legendre_params + lVar4) = *(float *)((long)local_48 + lVar4) * 3.1415927;
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x24);
  regenerateBuffer();
  return;
}

Assistant:

void rotateParams() {
    Perf stat("Rotate params");
    float newParams[9] = {0,0,0,0,0,0,0,0,0};

    int baseIndex = 0;
    float d_phi = float(M_PI) / phi_n;
    float d_theta = 2 * float(M_PI) / theta_n;
    for (int param = 0; param < 9; param++) {
        int shapeIndex = 0;
        for (int phi_i = 0; phi_i <= phi_n; phi_i++) {
            float sin_phi = sin(float(M_PI) * phi_i / phi_n);
            for (int theta_i = 0; theta_i < theta_n; theta_i++) {
                float integrand = legendre_scalars[baseIndex + shapeIndex + theta_i] * shape_scalars[shapeIndex + theta_i + 1]; // doesn't overflow because there's an extra on the end
                newParams[param] += integrand * d_phi * d_theta * sin_phi;
            }
            shapeIndex += theta_n + 1;
        }
        baseIndex += shapeIndex;
    }

    for (int c = 0; c < 9; c++) {
        legendre_params[c] = newParams[c] * M_PI; // For some reason it's off by a factor of M_PI. TODO: figure out why
    }

    regenerateBuffer();
}